

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseValueRangeElement
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  Token op_00;
  Token openBracket_00;
  Token closeBracket_00;
  bool bVar1;
  ExpressionSyntax *left_00;
  SourceLocation in_RDI;
  SourceRange SVar2;
  string_view sVar3;
  Token TVar4;
  Token closeBracket;
  ExpressionSyntax *right;
  Token op;
  ExpressionSyntax *left;
  Token openBracket;
  int in_stack_000001ac;
  Parser *in_stack_000001b0;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_000001bc;
  Parser *in_stack_ffffffffffffff00;
  TokenKind in_stack_ffffffffffffff0e;
  ParserBase *in_stack_ffffffffffffff10;
  ParserBase *in_stack_ffffffffffffff18;
  SourceLocation in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 in_stack_ffffffffffffff80 [16];
  TokenKind kind;
  SourceLocation in_stack_ffffffffffffff90;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_8;
  
  kind = in_stack_ffffffffffffff80._14_2_;
  code = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e);
  if (bVar1) {
    ParserBase::consume((ParserBase *)in_RDI);
    parseExpression(in_stack_ffffffffffffff00);
    Token::Token((Token *)in_stack_ffffffffffffff00);
    bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e);
    if ((bVar1) ||
       (bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e), bVar1)) {
      TVar4 = ParserBase::consume((ParserBase *)in_RDI);
      local_58 = TVar4._0_8_;
      local_48 = local_58;
      local_50 = TVar4.info;
      local_40 = local_50;
      if (*(int *)((long)in_RDI + 0xf4) < 1) {
        SVar2 = Token::range((Token *)in_RDI);
        in_stack_ffffffffffffff90 = SVar2.startLoc;
        SVar2.endLoc = in_stack_ffffffffffffff28;
        SVar2.startLoc = in_RDI;
        in_stack_ffffffffffffff18 =
             (ParserBase *)ParserBase::addDiag(in_stack_ffffffffffffff18,code,SVar2);
        sVar3 = slang::toString(Default);
        kind = sVar3._M_str._6_2_;
        sVar3._M_str = in_stack_ffffffffffffff50;
        sVar3._M_len = in_stack_ffffffffffffff48;
        Diagnostic::operator<<(in_stack_ffffffffffffff40,sVar3);
      }
    }
    else {
      TVar4 = ParserBase::expect((ParserBase *)in_stack_ffffffffffffff90,kind);
      local_90 = TVar4._0_8_;
      local_48 = local_90;
      local_88 = TVar4.info;
      local_40 = local_88;
    }
    left_00 = parseExpression(in_stack_ffffffffffffff00);
    TVar4 = ParserBase::expect((ParserBase *)in_stack_ffffffffffffff90,kind);
    local_a8 = TVar4._0_8_;
    local_a0 = TVar4.info;
    openBracket_00.info = (Info *)in_RDI;
    openBracket_00._0_8_ = in_stack_ffffffffffffff18;
    op_00.info = (Info *)in_stack_ffffffffffffff10;
    op_00._0_8_ = local_a0;
    closeBracket_00.info = local_40;
    closeBracket_00.kind = (undefined2)local_48;
    closeBracket_00._2_1_ = local_48._2_1_;
    closeBracket_00.numFlags.raw = local_48._3_1_;
    closeBracket_00.rawLen = local_48._4_4_;
    local_8 = slang::syntax::SyntaxFactory::valueRangeExpression
                        (local_a8,openBracket_00,left_00,op_00,(ExpressionSyntax *)local_a0,
                         closeBracket_00);
  }
  else {
    local_8 = (ValueRangeExpressionSyntax *)
              parseSubExpression(in_stack_000001b0,in_stack_000001bc,in_stack_000001ac);
  }
  return &local_8->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseValueRangeElement(bitmask<ExpressionOptions> options) {
    if (!peek(TokenKind::OpenBracket))
        return parseSubExpression(options, 0);

    auto openBracket = consume();
    auto& left = parseExpression();

    Token op;
    if (peek(TokenKind::PlusDivMinus) || peek(TokenKind::PlusModMinus)) {
        op = consume();
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, op.range())
                << toString(parseOptions.languageVersion);
        }
    }
    else {
        op = expect(TokenKind::Colon);
    }

    auto& right = parseExpression();
    auto closeBracket = expect(TokenKind::CloseBracket);
    return factory.valueRangeExpression(openBracket, left, op, right, closeBracket);
}